

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

string * __thiscall
flatbuffers::php::PhpGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Value *value)

{
  BaseType BVar1;
  EnumDef *pEVar2;
  bool bVar3;
  EnumVal *__rhs;
  int64_t t;
  char *__s;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  pEVar2 = (value->type).enum_def;
  if ((pEVar2 == (EnumDef *)0x0) ||
     (__rhs = EnumDef::FindByValue(pEVar2,&value->constant), __rhs == (EnumVal *)0x0)) {
    BVar1 = (value->type).base_type;
    if (BVar1 - BASE_TYPE_LONG < 2) {
      bVar3 = std::operator!=(&value->constant,"0");
      if (bVar3) {
        t = StringToInt((value->constant)._M_dataplus._M_p,10);
        NumToString<long>(__return_storage_ptr__,t);
        return __return_storage_ptr__;
      }
      __s = "0";
    }
    else if (BVar1 == BASE_TYPE_STRING) {
      __s = "null";
    }
    else {
      if (BVar1 != BASE_TYPE_BOOL) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&value->constant);
        return __return_storage_ptr__;
      }
      bVar3 = std::operator==(&value->constant,"0");
      __s = "true";
      if (bVar3) {
        __s = "false";
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_88);
  }
  else {
    pEVar2 = (value->type).enum_def;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_89);
    BaseGenerator::WrapInNameSpace
              (&local_68,&this->super_BaseGenerator,&pEVar2->super_Definition,&local_48);
    std::operator+(&local_88,&local_68,"::");
    std::operator+(__return_storage_ptr__,&local_88,&__rhs->name);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const Value &value) {
    if (value.type.enum_def) {
      if (auto val = value.type.enum_def->FindByValue(value.constant)) {
        return WrapInNameSpace(*value.type.enum_def) + "::" + val->name;
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING: return "null";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        if (value.constant != "0") {
          int64_t constant = StringToInt(value.constant.c_str());
          return NumToString(constant);
        }
        return "0";

      default: return value.constant;
    }
  }